

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cv_test.c
# Opt level: O1

void test_cv_cancel(testing t)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  nsync_note cancel_note;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  int iVar7;
  nsync_time b;
  nsync_time b_00;
  nsync_time nVar8;
  nsync_time nVar9;
  nsync_time nVar10;
  nsync_time nVar11;
  nsync_mu mu;
  nsync_cv cv;
  nsync_mu local_50;
  nsync_cv local_40;
  
  nsync_mu_init(&local_50);
  nsync_cv_init(&local_40);
  b = nsync_time_ms(1);
  b_00 = nsync_time_ms(100);
  nVar8 = nsync_time_now();
  nVar9 = nsync_time_ms(3600000);
  nVar8 = nsync_time_add(nVar8,nVar9);
  nsync_mu_lock(&local_50);
  iVar7 = 0x32;
  uVar6 = 0;
  do {
    nVar9 = nsync_time_now();
    nVar10 = nsync_time_ms(0x57);
    nVar9 = nsync_time_add(nVar9,nVar10);
    cancel_note = nsync_note_new((nsync_note)0x0,nVar9);
    uVar1 = nsync_cv_wait_with_deadline(&local_40,&local_50,nVar8,cancel_note);
    if (uVar1 != 0x7d) {
      pcVar4 = smprintf("nsync_cv_wait() returned non-cancelled (%d) for a cancellation; expected %d"
                        ,(ulong)uVar1,0x7d);
      testing_error_(t,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/testing/cv_test.c"
                     ,0x11e,pcVar4);
    }
    nVar10 = nsync_time_now();
    nVar11 = nsync_time_sub(nVar9,b);
    iVar2 = nsync_time_cmp(nVar10,nVar11);
    if (iVar2 < 0) {
      nVar11 = nsync_time_sub(nVar9,nVar10);
      pcVar4 = nsync_time_str(nVar11,2);
      pcVar5 = smprintf("nsync_cv_wait() returned %s too early",pcVar4);
      testing_error_(t,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/testing/cv_test.c"
                     ,0x123,pcVar5);
      free(pcVar4);
    }
    nVar11 = nsync_time_add(nVar9,b_00);
    iVar2 = nsync_time_cmp(nVar11,nVar10);
    nVar10 = nsync_time_now();
    nVar11.tv_nsec = 999999999;
    nVar11.tv_sec = 0x7fffffffffffffff;
    uVar1 = nsync_cv_wait_with_deadline(&local_40,&local_50,nVar11,cancel_note);
    if (uVar1 != 0x7d) {
      pcVar4 = smprintf("nsync_cv_wait() returned non-cancelled (%d) for a cancellation; expected %d"
                        ,(ulong)uVar1,0x7d);
      testing_error_(t,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/testing/cv_test.c"
                     ,0x131,pcVar4);
    }
    nVar11 = nsync_time_now();
    iVar3 = nsync_time_cmp(nVar11,nVar10);
    if (iVar3 < 0) {
      nVar9 = nsync_time_sub(nVar9,nVar11);
      pcVar4 = nsync_time_str(nVar9,2);
      pcVar5 = smprintf("nsync_cv_wait() returned %s too early",pcVar4);
      testing_error_(t,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/testing/cv_test.c"
                     ,0x136,pcVar5);
      free(pcVar4);
    }
    nVar9 = nsync_time_add(nVar10,b_00);
    iVar3 = nsync_time_cmp(nVar9,nVar11);
    uVar6 = (uVar6 - (iVar2 >> 0x1f)) - (iVar3 >> 0x1f);
    nsync_note_notify(cancel_note);
    nsync_note_free(cancel_note);
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  nsync_mu_unlock(&local_50);
  if (0x19 < (int)uVar6) {
    pcVar4 = smprintf("nsync_cv_wait() returned too late %d times",(ulong)uVar6);
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/testing/cv_test.c"
                   ,0x142,pcVar4);
  }
  return;
}

Assistant:

static void test_cv_cancel (testing t) {
	nsync_time future_time;
	int too_late_violations;
	nsync_mu mu;
	nsync_cv cv;
	int i;
	nsync_time too_early;
	nsync_time too_late;

	nsync_mu_init (&mu);
	nsync_cv_init (&cv);
	too_early = nsync_time_ms (TOO_EARLY_MS);
	too_late = nsync_time_ms (TOO_LATE_MS);

	/* The loops below cancel after 87 milliseconds, like the timeout tests above. */

	future_time = nsync_time_add (nsync_time_now (), nsync_time_ms (3600000)); /* test cancels with timeout */

	too_late_violations = 0;
	nsync_mu_lock (&mu);
	for (i = 0; i != 50; i++) {
		int x;
		nsync_note cancel;
		nsync_time end_time;
		nsync_time start_time;
		nsync_time expected_end_time;
		start_time = nsync_time_now ();
		expected_end_time = nsync_time_add (start_time, nsync_time_ms (87));

		cancel = nsync_note_new (NULL, expected_end_time);

		x = nsync_cv_wait_with_deadline (&cv, &mu, future_time, cancel);
		if (x != ECANCELED) {
			TEST_FATAL (t, ("nsync_cv_wait() returned non-cancelled (%d) for "
				   "a cancellation; expected %d",
				   x, ECANCELED));
		}
		end_time = nsync_time_now ();
		if (nsync_time_cmp (end_time, nsync_time_sub (expected_end_time, too_early)) < 0) {
			char *elapsed_str = nsync_time_str (nsync_time_sub (expected_end_time, end_time), 2);
			TEST_ERROR (t, ("nsync_cv_wait() returned %s too early", elapsed_str));
			free (elapsed_str);
		}
		if (nsync_time_cmp (nsync_time_add (expected_end_time, too_late), end_time) < 0) {
			too_late_violations++;
		}

		/* Check that an already cancelled wait returns immediately. */
		start_time = nsync_time_now ();

		x = nsync_cv_wait_with_deadline (&cv, &mu, nsync_time_no_deadline, cancel);
		if (x != ECANCELED) {
			TEST_FATAL (t, ("nsync_cv_wait() returned non-cancelled (%d) for "
				   "a cancellation; expected %d",
				   x, ECANCELED));
		}
		end_time = nsync_time_now ();
		if (nsync_time_cmp (end_time, start_time) < 0) {
			char *elapsed_str = nsync_time_str (nsync_time_sub (expected_end_time, end_time), 2);
			TEST_ERROR (t, ("nsync_cv_wait() returned %s too early", elapsed_str));
			free (elapsed_str);
		}
		if (nsync_time_cmp (nsync_time_add (start_time, too_late), end_time) < 0) {
			too_late_violations++;
		}
		nsync_note_notify (cancel);

		nsync_note_free (cancel);
	}
	nsync_mu_unlock (&mu);
	if (too_late_violations > TOO_LATE_ALLOWED) {
		TEST_ERROR (t, ("nsync_cv_wait() returned too late %d times", too_late_violations));
	}
}